

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_mgr_init(mg_mgr *m,void *user_data)

{
  m->ctl[0] = 0;
  m->ctl[1] = 0;
  m->user_data = (void *)0x0;
  m->active_connections = (mg_connection *)0x0;
  m->hexdump_file = (char *)0x0;
  m->mgr_data = (void *)0x0;
  m->ctl[0] = -1;
  m->ctl[1] = -1;
  m->user_data = user_data;
  __sysv_signal(0xd,(__sighandler_t)0x1);
  mg_ev_mgr_init(m);
  if (LL_DEBUG < s_cs_log_level) {
    mg_mgr_init_cold_1();
  }
  return;
}

Assistant:

void mg_mgr_init(struct mg_mgr *m, void *user_data) {
    memset(m, 0, sizeof(*m));
#ifndef MG_DISABLE_SOCKETPAIR
    m->ctl[0] = m->ctl[1] = INVALID_SOCKET;
#endif
    m->user_data = user_data;

#ifdef _WIN32
                                                                                                                            {
    WSADATA data;
    WSAStartup(MAKEWORD(2, 2), &data);
  }
#elif !defined(AVR_LIBC) && !defined(MG_ESP8266)
    /* Ignore SIGPIPE signal, so if client cancels the request, it
   * won't kill the whole process. */
    signal(SIGPIPE, SIG_IGN);
#endif

#ifdef MG_ENABLE_SSL
                                                                                                                            {
    static int init_done;
    if (!init_done) {
      SSL_library_init();
      init_done++;
    }
  }
#endif

    mg_ev_mgr_init(m);
    DBG(("=================================="));
    DBG(("init mgr=%p", m));
}